

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGGradientElement::SVGGradientElement
          (SVGGradientElement *this,Document *document,ElementID id)

{
  ElementID id_local;
  Document *document_local;
  SVGGradientElement *this_local;
  
  SVGPaintElement::SVGPaintElement(&this->super_SVGPaintElement,document,id);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGGradientElement_001c33f0;
  SVGURIReference::SVGURIReference(&this->super_SVGURIReference,(SVGElement *)this);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGGradientElement_001c33f0;
  SVGTransform::SVGTransform(&this->m_gradientTransform,GradientTransform);
  SVGEnumeration<lunasvg::Units>::SVGEnumeration
            (&this->m_gradientUnits,GradientUnits,ObjectBoundingBox);
  SVGEnumeration<lunasvg::SpreadMethod>::SVGEnumeration(&this->m_spreadMethod,SpreadMethod,Pad);
  SVGElement::addProperty((SVGElement *)this,&(this->m_gradientTransform).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_gradientUnits).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_spreadMethod).super_SVGProperty);
  return;
}

Assistant:

SVGGradientElement::SVGGradientElement(Document* document, ElementID id)
    : SVGPaintElement(document, id)
    , SVGURIReference(this)
    , m_gradientTransform(PropertyID::GradientTransform)
    , m_gradientUnits(PropertyID::GradientUnits, Units::ObjectBoundingBox)
    , m_spreadMethod(PropertyID::SpreadMethod, SpreadMethod::Pad)
{
    addProperty(m_gradientTransform);
    addProperty(m_gradientUnits);
    addProperty(m_spreadMethod);
}